

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

void do_test_ecdsa_sign(int nid,ptls_openssl_signature_scheme_t *schemes)

{
  EC_KEY *key;
  EVP_PKEY *pkey;
  
  key = EC_KEY_new_by_curve_name(nid);
  EC_KEY_generate_key(key);
  pkey = EVP_PKEY_new();
  EVP_PKEY_set1_EC_KEY(pkey,key);
  EC_KEY_free(key);
  test_sign_verify((EVP_PKEY *)pkey,schemes);
  EVP_PKEY_free(pkey);
  return;
}

Assistant:

static void do_test_ecdsa_sign(int nid, const ptls_openssl_signature_scheme_t *schemes)
{
    EVP_PKEY *pkey;

    { /* create pkey */
        EC_KEY *eckey = EC_KEY_new_by_curve_name(nid);
        EC_KEY_generate_key(eckey);
        pkey = EVP_PKEY_new();
        EVP_PKEY_set1_EC_KEY(pkey, eckey);
        EC_KEY_free(eckey);
    }

    test_sign_verify(pkey, schemes);
    EVP_PKEY_free(pkey);
}